

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator::GenerateParsingCode
          (ImmutableStringOneofFieldLiteGenerator *this,Printer *printer)

{
  long lVar1;
  char *text;
  
  lVar1 = *(long *)((this->super_ImmutableStringFieldLiteGenerator).descriptor_ + 0x30);
  if (*(int *)(lVar1 + 0x8c) == 3) {
    text = 
    "String s = input.readStringRequireUtf8();\n$set_oneof_case_message$;\n$oneof_name$_ = s;\n";
  }
  else {
    text = "String s = input.readString();\n$set_oneof_case_message$;\n$oneof_name$_ = s;\n";
    if (*(char *)(*(long *)(lVar1 + 0xa0) + 0xa2) != '\0') {
      text = 
      "String s = input.readStringRequireUtf8();\n$set_oneof_case_message$;\n$oneof_name$_ = s;\n";
    }
  }
  io::Printer::Print(printer,&(this->super_ImmutableStringFieldLiteGenerator).variables_,text);
  return;
}

Assistant:

void ImmutableStringOneofFieldLiteGenerator::
GenerateParsingCode(io::Printer* printer) const {
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
      "String s = input.readStringRequireUtf8();\n"
      "$set_oneof_case_message$;\n"
      "$oneof_name$_ = s;\n");
  } else {
    // Lite runtime should attempt to reduce allocations by attempting to
    // construct the string directly from the input stream buffer. This avoids
    // spurious intermediary ByteString allocations, cutting overall allocations
    // in half.
    printer->Print(variables_,
      "String s = input.readString();\n"
      "$set_oneof_case_message$;\n"
      "$oneof_name$_ = s;\n");
  }
}